

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqrtx.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  Solution local_19;
  char **ppcStack_18;
  Solution solution;
  char **argv_local;
  int argc_local;
  
  ppcStack_18 = argv;
  iVar1 = Solution::mySqrt(&local_19,0);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  iVar1 = Solution::mySqrt(&local_19,1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  iVar1 = Solution::mySqrt(&local_19,2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  iVar1 = Solution::mySqrt(&local_19,3);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  iVar1 = Solution::mySqrt(&local_19,4);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  iVar1 = Solution::mySqrt(&local_19,9);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  iVar1 = Solution::mySqrt(&local_19,10);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	Solution solution;

	cout << solution.mySqrt(0) << endl;
	cout << solution.mySqrt(1) << endl;
	cout << solution.mySqrt(2) << endl;
	cout << solution.mySqrt(3) << endl;
	cout << solution.mySqrt(4) << endl;

	cout << solution.mySqrt(9) << endl;
	cout << solution.mySqrt(10) << endl;

	return 0;
}